

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileReader.cpp
# Opt level: O0

bool __thiscall
BufferedFileReader::openStream
          (BufferedFileReader *this,int readerID,char *streamName,int pid,CodecInfo *codecInfo)

{
  bool bVar1;
  ReaderData *pRVar2;
  FileReaderData *local_50;
  FileReaderData *data;
  CodecInfo *codecInfo_local;
  int pid_local;
  char *streamName_local;
  int readerID_local;
  BufferedFileReader *this_local;
  
  pRVar2 = BufferedReader::getReader(&this->super_BufferedReader,readerID);
  if (pRVar2 == (ReaderData *)0x0) {
    local_50 = (FileReaderData *)0x0;
  }
  else {
    local_50 = (FileReaderData *)
               __dynamic_cast(pRVar2,&ReaderData::typeinfo,&FileReaderData::typeinfo,0);
  }
  if (local_50 == (FileReaderData *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    (local_50->super_ReaderData).m_firstBlock = true;
    (local_50->super_ReaderData).m_lastBlock = false;
    std::__cxx11::string::operator=((string *)&(local_50->super_ReaderData).m_streamName,streamName)
    ;
    local_50->m_fileHeaderSize = 0;
    FileReaderData::closeStream(local_50);
    bVar1 = FileReaderData::openStream(local_50);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BufferedFileReader::openStream(const int readerID, const char* streamName, int pid, const CodecInfo* codecInfo)
{
    const auto data = dynamic_cast<FileReaderData*>(getReader(readerID));

    if (data == nullptr)
    {
        LTRACE(LT_ERROR, 0, "Unknown readerID " << readerID);
        return false;
    }
    data->m_firstBlock = true;
    data->m_lastBlock = false;
    data->m_streamName = streamName;
    data->m_fileHeaderSize = 0;
    data->closeStream();
    if (!data->openStream())
    {
        return false;
    }
    return true;
}